

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler::handle
          (AnalyzeVariableScopeAccessHandler *this,Op op,uint32_t *args,uint32_t length)

{
  Compiler *pCVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  mapped_type *pmVar5;
  Variant *this_00;
  mapped_type *pmVar6;
  size_type sVar7;
  SPIRType *pSVar8;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar9;
  uint local_23c;
  uint local_238;
  uint32_t i_9;
  uint32_t i_8;
  uint32_t i_7;
  uint32_t i_6;
  uint32_t i_5;
  uint32_t i_4;
  uint32_t i_3;
  uint32_t local_210;
  uint32_t local_20c;
  _Node_iterator_base<unsigned_int,_false> local_208;
  undefined1 local_200;
  uint32_t local_1f8;
  uint32_t local_1f4;
  SPIRVariable *local_1f0;
  SPIRVariable *var_5;
  uint32_t i_2;
  undefined1 local_1d8;
  uint32_t local_1d0;
  uint32_t local_1cc;
  SPIRVariable *local_1c8;
  SPIRVariable *var_4;
  _Node_iterator_base<unsigned_int,_false> _Stack_1b8;
  uint32_t ptr_2;
  undefined1 local_1b0;
  _Node_iterator_base<unsigned_int,_false> local_1a8;
  undefined1 local_1a0;
  uint32_t local_198;
  uint32_t local_194;
  SPIRVariable *local_190;
  SPIRVariable *var_3;
  uint32_t local_174;
  uint32_t local_170;
  uint local_16c;
  _Node_iterator_base<unsigned_int,_false> _Stack_168;
  uint32_t i_1;
  undefined1 local_160;
  uint32_t local_158;
  uint32_t local_154;
  _Node_iterator_base<unsigned_int,_false> local_150;
  undefined1 local_148;
  uint32_t local_140;
  uint32_t local_13c;
  _Node_iterator_base<unsigned_int,_false> local_138;
  undefined1 local_130;
  uint32_t local_128;
  uint32_t local_124;
  SPIRVariable *local_120;
  SPIRVariable *var_2;
  ID rhs;
  ID lhs;
  TypedID<(spirv_cross::Types)2> local_fc;
  SPIRVariable *local_f8;
  SPIRVariable *backing_variable;
  SPIRExpression *local_e8;
  SPIRExpression *e;
  undefined1 local_d8;
  uint local_cc;
  _Node_iterator_base<unsigned_int,_false> _Stack_c8;
  uint32_t i;
  undefined1 local_c0;
  uint32_t local_b4;
  _Node_iterator_base<unsigned_int,_false> local_b0;
  undefined1 local_a8;
  uint32_t local_a0;
  uint32_t local_9c;
  SPIRVariable *local_98;
  SPIRVariable *var_1;
  _Node_iterator_base<unsigned_int,_false> _Stack_88;
  uint32_t ptr_1;
  undefined1 local_80;
  uint32_t local_78;
  uint32_t local_74;
  _Node_iterator_base<unsigned_int,_false> local_70;
  undefined1 local_68;
  uint32_t local_60;
  uint32_t local_5c;
  _Node_iterator_base<unsigned_int,_false> local_58;
  undefined1 local_50;
  uint32_t local_48;
  uint32_t local_44;
  SPIRVariable *local_40;
  SPIRVariable *var;
  ID ptr;
  uint32_t result_id;
  uint32_t result_type;
  uint32_t length_local;
  uint32_t *args_local;
  Op op_local;
  AnalyzeVariableScopeAccessHandler *this_local;
  
  bVar2 = instruction_to_result_type
                    (this->compiler,&ptr.id,(uint32_t *)((long)&var + 4),op,args,length);
  if (bVar2) {
    pmVar5 = ::std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->result_id_to_type,(key_type *)((long)&var + 4));
    *pmVar5 = ptr.id;
  }
  switch(op) {
  case OpLine:
  case OpArrayLength:
  case OpNoLine:
    break;
  default:
    for (local_23c = 0; local_23c < length; local_23c = local_23c + 1) {
      uVar3 = args[local_23c];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    break;
  case OpExtInst:
    for (i_5 = 4; i_5 < length; i_5 = i_5 + 1) {
      uVar3 = args[i_5];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    uVar3 = args[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    break;
  case OpFunctionCall:
    if (length < 3) {
      return false;
    }
    pCVar1 = this->compiler;
    TypedID<(spirv_cross::Types)1>::TypedID
              ((TypedID<(spirv_cross::Types)1> *)((long)&var_5 + 4),*args);
    pSVar8 = get_type(pCVar1,var_5._4_4_);
    if (*(int *)&(pSVar8->super_IVariant).field_0xc != 1) {
      uVar3 = args[1];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    for (var_5._0_4_ = 0; (uint)var_5 < length - 3; var_5._0_4_ = (uint)var_5 + 1) {
      local_1f0 = maybe_get_backing_variable(this->compiler,args[(ulong)(uint)var_5 + 3]);
      if (local_1f0 != (SPIRVariable *)0x0) {
        local_1f4 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_1f0->super_IVariant).self);
        pmVar6 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->accessed_variables_to_block,&local_1f4);
        local_1f8 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(this->current_block->super_IVariant).self);
        pVar9 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert(pmVar6,&local_1f8);
        local_208._M_cur =
             (__node_type *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_200 = pVar9.second;
        local_20c = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_1f0->super_IVariant).self);
        pmVar6 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->partial_write_variables_to_block,&local_20c);
        local_210 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(this->current_block->super_IVariant).self);
        ::std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::insert(pmVar6,&local_210);
      }
      uVar3 = args[(ulong)(uint)var_5 + 3];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    break;
  case OpLoad:
    if (length < 3) {
      return false;
    }
    var_4._4_4_ = args[2];
    local_1c8 = maybe_get_backing_variable(this->compiler,var_4._4_4_);
    if (local_1c8 != (SPIRVariable *)0x0) {
      local_1cc = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_1c8->super_IVariant).self);
      pmVar6 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_1cc);
      local_1d0 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(this->current_block->super_IVariant).self);
      pVar9 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(pmVar6,&local_1d0);
      _i_2 = (__node_type *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_1d8 = pVar9.second;
    }
    uVar3 = args[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    uVar3 = args[2];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    break;
  case OpStore:
    if (length < 2) {
      return false;
    }
    TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)&var,*args);
    pCVar1 = this->compiler;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var);
    local_40 = maybe_get_backing_variable(pCVar1,uVar3);
    if (local_40 != (SPIRVariable *)0x0) {
      local_44 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_40->super_IVariant).self)
      ;
      pmVar6 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_44);
      local_48 = TypedID::operator_cast_to_unsigned_int
                           ((TypedID *)&(this->current_block->super_IVariant).self);
      pVar9 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(pmVar6,&local_48);
      local_58._M_cur =
           (__node_type *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_50 = pVar9.second;
      bVar2 = TypedID<(spirv_cross::Types)0>::operator==
                        (&(local_40->super_IVariant).self,(TypedID<(spirv_cross::Types)0> *)&var);
      if (bVar2) {
        local_5c = TypedID::operator_cast_to_unsigned_int
                             ((TypedID *)&(local_40->super_IVariant).self);
        pmVar6 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->complete_write_variables_to_block,&local_5c);
        local_60 = TypedID::operator_cast_to_unsigned_int
                             ((TypedID *)&(this->current_block->super_IVariant).self);
        pVar9 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert(pmVar6,&local_60);
        local_70._M_cur =
             (__node_type *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_68 = pVar9.second;
      }
      else {
        local_74 = TypedID::operator_cast_to_unsigned_int
                             ((TypedID *)&(local_40->super_IVariant).self);
        pmVar6 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->partial_write_variables_to_block,&local_74);
        local_78 = TypedID::operator_cast_to_unsigned_int
                             ((TypedID *)&(this->current_block->super_IVariant).self);
        pVar9 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert(pmVar6,&local_78);
        _Stack_88._M_cur =
             (__node_type *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_80 = pVar9.second;
      }
    }
    uVar3 = *args;
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    uVar3 = args[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    break;
  case OpCopyMemory:
    if (length < 2) {
      return false;
    }
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)((long)&var_2 + 4),*args);
    TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)&var_2,args[1]);
    pCVar1 = this->compiler;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&var_2 + 4));
    local_120 = maybe_get_backing_variable(pCVar1,uVar3);
    if (local_120 != (SPIRVariable *)0x0) {
      local_124 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_120->super_IVariant).self);
      pmVar6 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_124);
      local_128 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(this->current_block->super_IVariant).self);
      pVar9 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(pmVar6,&local_128);
      local_138._M_cur =
           (__node_type *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_130 = pVar9.second;
      bVar2 = TypedID<(spirv_cross::Types)0>::operator==
                        (&(local_120->super_IVariant).self,
                         (TypedID<(spirv_cross::Types)0> *)((long)&var_2 + 4));
      if (bVar2) {
        local_13c = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_120->super_IVariant).self);
        pmVar6 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->complete_write_variables_to_block,&local_13c);
        local_140 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(this->current_block->super_IVariant).self);
        pVar9 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert(pmVar6,&local_140);
        local_150._M_cur =
             (__node_type *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_148 = pVar9.second;
      }
      else {
        local_154 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_120->super_IVariant).self);
        pmVar6 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->partial_write_variables_to_block,&local_154);
        local_158 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(this->current_block->super_IVariant).self);
        pVar9 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert(pmVar6,&local_158);
        _Stack_168._M_cur =
             (__node_type *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_160 = pVar9.second;
      }
    }
    for (local_16c = 0; local_16c < 2; local_16c = local_16c + 1) {
      uVar3 = args[local_16c];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    pCVar1 = this->compiler;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_2);
    local_120 = maybe_get_backing_variable(pCVar1,uVar3);
    if (local_120 != (SPIRVariable *)0x0) {
      local_170 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_120->super_IVariant).self);
      pmVar6 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_170);
      local_174 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(this->current_block->super_IVariant).self);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert(pmVar6,&local_174);
    }
    break;
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
    if (length < 3) {
      return false;
    }
    var_1._4_4_ = args[2];
    local_98 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,var_1._4_4_);
    if (local_98 != (SPIRVariable *)0x0) {
      local_9c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_98->super_IVariant).self)
      ;
      pmVar6 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_9c);
      local_a0 = TypedID::operator_cast_to_unsigned_int
                           ((TypedID *)&(this->current_block->super_IVariant).self);
      pVar9 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(pmVar6,&local_a0);
      local_b0._M_cur =
           (__node_type *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_a8 = pVar9.second;
      pmVar6 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->access_chain_children,args + 1);
      local_b4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_98->super_IVariant).self)
      ;
      pVar9 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(pmVar6,&local_b4);
      _Stack_c8._M_cur =
           (__node_type *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_c0 = pVar9.second;
    }
    for (local_cc = 2; local_cc < length; local_cc = local_cc + 1) {
      uVar3 = args[local_cc];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
      pmVar6 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->access_chain_children,args + 1);
      pVar9 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(pmVar6,args + local_cc);
      e = (SPIRExpression *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_d8 = pVar9.second;
    }
    uVar3 = args[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    backing_variable._7_1_ = 1;
    local_e8 = set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int_const&,bool>
                         (this->compiler,args[1],(char (*) [1])0x4d8596,args,
                          (bool *)((long)&backing_variable + 7));
    local_f8 = maybe_get_backing_variable(this->compiler,var_1._4_4_);
    if (local_f8 == (SPIRVariable *)0x0) {
      TypedID<(spirv_cross::Types)2>::TypedID(&local_fc,0);
    }
    else {
      TypedID<(spirv_cross::Types)2>::TypedID(&local_fc,&(local_f8->super_IVariant).self);
    }
    TypedID<(spirv_cross::Types)0>::operator=(&local_e8->loaded_from,&local_fc);
    this_00 = VectorView<spirv_cross::Variant>::operator[]
                        (&(this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>,
                         (ulong)args[1]);
    Variant::set_allow_type_rewrite(this_00);
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(&this->access_chain_expressions,args + 1);
    break;
  case OpVectorShuffle:
  case OpCompositeInsert:
    for (i_6 = 1; i_6 < 4; i_6 = i_6 + 1) {
      uVar3 = args[i_6];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    break;
  case OpCompositeExtract:
    for (i_7 = 1; i_7 < 3; i_7 = i_7 + 1) {
      uVar3 = args[i_7];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    break;
  case OpCopyObject:
    if (length < 3) {
      return false;
    }
    local_190 = maybe_get_backing_variable(this->compiler,args[2]);
    if (local_190 != (SPIRVariable *)0x0) {
      local_194 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_190->super_IVariant).self);
      pmVar6 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_194);
      local_198 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(this->current_block->super_IVariant).self);
      pVar9 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(pmVar6,&local_198);
      local_1a8._M_cur =
           (__node_type *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_1a0 = pVar9.second;
    }
    uVar3 = args[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    sVar7 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->access_chain_expressions,args + 2);
    if (sVar7 != 0) {
      pVar9 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&this->access_chain_expressions,args + 1);
      _Stack_1b8._M_cur =
           (__node_type *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_1b0 = pVar9.second;
    }
    uVar3 = args[2];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    break;
  case OpImageSampleImplicitLod:
  case OpImageSampleExplicitLod:
  case OpImageSampleProjImplicitLod:
  case OpImageSampleProjExplicitLod:
  case OpImageFetch:
  case OpImageRead:
  case OpImageSparseSampleImplicitLod:
  case OpImageSparseSampleExplicitLod:
  case OpImageSparseSampleProjImplicitLod:
  case OpImageSparseSampleProjExplicitLod:
  case OpImageSparseFetch:
  case OpImageSparseRead:
    for (i_9 = 1; i_9 < length; i_9 = i_9 + 1) {
      if (i_9 != 4) {
        uVar3 = args[i_9];
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this->current_block->super_IVariant).self);
        notify_variable_access(this,uVar3,uVar4);
      }
    }
    break;
  case OpImageSampleDrefImplicitLod:
  case OpImageSampleDrefExplicitLod:
  case OpImageSampleProjDrefImplicitLod:
  case OpImageSampleProjDrefExplicitLod:
  case OpImageGather:
  case OpImageDrefGather:
  case OpImageSparseSampleDrefImplicitLod:
  case OpImageSparseSampleDrefExplicitLod:
  case OpImageSparseSampleProjDrefImplicitLod:
  case OpImageSparseSampleProjDrefExplicitLod:
  case OpImageSparseGather:
  case OpImageSparseDrefGather:
    for (local_238 = 1; local_238 < length; local_238 = local_238 + 1) {
      if (local_238 != 5) {
        uVar3 = args[local_238];
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this->current_block->super_IVariant).self);
        notify_variable_access(this,uVar3,uVar4);
      }
    }
    break;
  case OpImageWrite:
    for (i_8 = 0; i_8 < length; i_8 = i_8 + 1) {
      if (i_8 != 3) {
        uVar3 = args[i_8];
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this->current_block->super_IVariant).self);
        notify_variable_access(this,uVar3,uVar4);
      }
    }
  }
  return true;
}

Assistant:

bool Compiler::AnalyzeVariableScopeAccessHandler::handle(spv::Op op, const uint32_t *args, uint32_t length)
{
	// Keep track of the types of temporaries, so we can hoist them out as necessary.
	uint32_t result_type, result_id;
	if (compiler.instruction_to_result_type(result_type, result_id, op, args, length))
		result_id_to_type[result_id] = result_type;

	switch (op)
	{
	case OpStore:
	{
		if (length < 2)
			return false;

		ID ptr = args[0];
		auto *var = compiler.maybe_get_backing_variable(ptr);

		// If we store through an access chain, we have a partial write.
		if (var)
		{
			accessed_variables_to_block[var->self].insert(current_block->self);
			if (var->self == ptr)
				complete_write_variables_to_block[var->self].insert(current_block->self);
			else
				partial_write_variables_to_block[var->self].insert(current_block->self);
		}

		// args[0] might be an access chain we have to track use of.
		notify_variable_access(args[0], current_block->self);
		// Might try to store a Phi variable here.
		notify_variable_access(args[1], current_block->self);
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		// Access chains used in multiple blocks mean hoisting all the variables used to construct the access chain as not all backends can use pointers.
		uint32_t ptr = args[2];
		auto *var = compiler.maybe_get<SPIRVariable>(ptr);
		if (var)
		{
			accessed_variables_to_block[var->self].insert(current_block->self);
			access_chain_children[args[1]].insert(var->self);
		}

		// args[2] might be another access chain we have to track use of.
		for (uint32_t i = 2; i < length; i++)
		{
			notify_variable_access(args[i], current_block->self);
			access_chain_children[args[1]].insert(args[i]);
		}

		// Also keep track of the access chain pointer itself.
		// In exceptionally rare cases, we can end up with a case where
		// the access chain is generated in the loop body, but is consumed in continue block.
		// This means we need complex loop workarounds, and we must detect this via CFG analysis.
		notify_variable_access(args[1], current_block->self);

		// The result of an access chain is a fixed expression and is not really considered a temporary.
		auto &e = compiler.set<SPIRExpression>(args[1], "", args[0], true);
		auto *backing_variable = compiler.maybe_get_backing_variable(ptr);
		e.loaded_from = backing_variable ? VariableID(backing_variable->self) : VariableID(0);

		// Other backends might use SPIRAccessChain for this later.
		compiler.ir.ids[args[1]].set_allow_type_rewrite();
		access_chain_expressions.insert(args[1]);
		break;
	}

	case OpCopyMemory:
	{
		if (length < 2)
			return false;

		ID lhs = args[0];
		ID rhs = args[1];
		auto *var = compiler.maybe_get_backing_variable(lhs);

		// If we store through an access chain, we have a partial write.
		if (var)
		{
			accessed_variables_to_block[var->self].insert(current_block->self);
			if (var->self == lhs)
				complete_write_variables_to_block[var->self].insert(current_block->self);
			else
				partial_write_variables_to_block[var->self].insert(current_block->self);
		}

		// args[0:1] might be access chains we have to track use of.
		for (uint32_t i = 0; i < 2; i++)
			notify_variable_access(args[i], current_block->self);

		var = compiler.maybe_get_backing_variable(rhs);
		if (var)
			accessed_variables_to_block[var->self].insert(current_block->self);
		break;
	}

	case OpCopyObject:
	{
		if (length < 3)
			return false;

		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (var)
			accessed_variables_to_block[var->self].insert(current_block->self);

		// Might be an access chain which we have to keep track of.
		notify_variable_access(args[1], current_block->self);
		if (access_chain_expressions.count(args[2]))
			access_chain_expressions.insert(args[1]);

		// Might try to copy a Phi variable here.
		notify_variable_access(args[2], current_block->self);
		break;
	}

	case OpLoad:
	{
		if (length < 3)
			return false;
		uint32_t ptr = args[2];
		auto *var = compiler.maybe_get_backing_variable(ptr);
		if (var)
			accessed_variables_to_block[var->self].insert(current_block->self);

		// Loaded value is a temporary.
		notify_variable_access(args[1], current_block->self);

		// Might be an access chain we have to track use of.
		notify_variable_access(args[2], current_block->self);
		break;
	}

	case OpFunctionCall:
	{
		if (length < 3)
			return false;

		// Return value may be a temporary.
		if (compiler.get_type(args[0]).basetype != SPIRType::Void)
			notify_variable_access(args[1], current_block->self);

		length -= 3;
		args += 3;

		for (uint32_t i = 0; i < length; i++)
		{
			auto *var = compiler.maybe_get_backing_variable(args[i]);
			if (var)
			{
				accessed_variables_to_block[var->self].insert(current_block->self);
				// Assume we can get partial writes to this variable.
				partial_write_variables_to_block[var->self].insert(current_block->self);
			}

			// Cannot easily prove if argument we pass to a function is completely written.
			// Usually, functions write to a dummy variable,
			// which is then copied to in full to the real argument.

			// Might try to copy a Phi variable here.
			notify_variable_access(args[i], current_block->self);
		}
		break;
	}

	case OpExtInst:
	{
		for (uint32_t i = 4; i < length; i++)
			notify_variable_access(args[i], current_block->self);
		notify_variable_access(args[1], current_block->self);
		break;
	}

	case OpArrayLength:
	case OpLine:
	case OpNoLine:
		// Uses literals, but cannot be a phi variable or temporary, so ignore.
		break;

		// Atomics shouldn't be able to access function-local variables.
		// Some GLSL builtins access a pointer.

	case OpCompositeInsert:
	case OpVectorShuffle:
		// Specialize for opcode which contains literals.
		for (uint32_t i = 1; i < 4; i++)
			notify_variable_access(args[i], current_block->self);
		break;

	case OpCompositeExtract:
		// Specialize for opcode which contains literals.
		for (uint32_t i = 1; i < 3; i++)
			notify_variable_access(args[i], current_block->self);
		break;

	case OpImageWrite:
		for (uint32_t i = 0; i < length; i++)
		{
			// Argument 3 is a literal.
			if (i != 3)
				notify_variable_access(args[i], current_block->self);
		}
		break;

	case OpImageSampleImplicitLod:
	case OpImageSampleExplicitLod:
	case OpImageSparseSampleImplicitLod:
	case OpImageSparseSampleExplicitLod:
	case OpImageSampleProjImplicitLod:
	case OpImageSampleProjExplicitLod:
	case OpImageSparseSampleProjImplicitLod:
	case OpImageSparseSampleProjExplicitLod:
	case OpImageFetch:
	case OpImageSparseFetch:
	case OpImageRead:
	case OpImageSparseRead:
		for (uint32_t i = 1; i < length; i++)
		{
			// Argument 4 is a literal.
			if (i != 4)
				notify_variable_access(args[i], current_block->self);
		}
		break;

	case OpImageSampleDrefImplicitLod:
	case OpImageSampleDrefExplicitLod:
	case OpImageSparseSampleDrefImplicitLod:
	case OpImageSparseSampleDrefExplicitLod:
	case OpImageSampleProjDrefImplicitLod:
	case OpImageSampleProjDrefExplicitLod:
	case OpImageSparseSampleProjDrefImplicitLod:
	case OpImageSparseSampleProjDrefExplicitLod:
	case OpImageGather:
	case OpImageSparseGather:
	case OpImageDrefGather:
	case OpImageSparseDrefGather:
		for (uint32_t i = 1; i < length; i++)
		{
			// Argument 5 is a literal.
			if (i != 5)
				notify_variable_access(args[i], current_block->self);
		}
		break;

	default:
	{
		// Rather dirty way of figuring out where Phi variables are used.
		// As long as only IDs are used, we can scan through instructions and try to find any evidence that
		// the ID of a variable has been used.
		// There are potential false positives here where a literal is used in-place of an ID,
		// but worst case, it does not affect the correctness of the compile.
		// Exhaustive analysis would be better here, but it's not worth it for now.
		for (uint32_t i = 0; i < length; i++)
			notify_variable_access(args[i], current_block->self);
		break;
	}
	}
	return true;
}